

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Iterating_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  pointer psVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer psVar7;
  char *in_R9;
  int i;
  int iVar8;
  AssertionResult gtest_ar_;
  iterator it;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  AssertHelper local_e8;
  internal local_e0 [8];
  undefined8 *local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [40];
  const_iterator local_98;
  const_nonempty_iterator local_90;
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_88;
  undefined1 local_80 [80];
  
  iVar8 = 1;
  local_d0._0_4_ = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0xb);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0x6f);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0x457);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0x2b67);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0x1b207);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0x10f447);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0xa98ac7);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_d0._0_4_ = UniqueObjectHelper<int>(0x69f6bc7);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  insert((pair<google::sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
          *)local_80,this_00,(value_type *)local_d0);
  local_88 = &this_00->rep;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin((const_iterator *)local_80,&this_00->rep);
  local_80._72_8_ =
       &(this->
        super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ).
        super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_;
  do {
    uVar6 = local_80._32_8_;
    uVar5 = local_80._24_8_;
    uVar4 = local_80._16_8_;
    uVar3 = local_80._8_8_;
    local_80._32_8_ = (long)(pointer *)local_80._32_8_ + 4;
    psVar7 = (pointer)local_80._24_8_;
    if ((pointer)local_80._32_8_ ==
        (pointer)(*(pointer *)local_80._24_8_ + ((Settings *)(local_80._24_8_ + 8))->num_buckets)) {
      do {
        psVar7 = (pointer)(local_80._24_8_ + 0x28);
        if (psVar7 == (pointer)local_80._16_8_) break;
        local_80._32_8_ = psVar7->group;
        psVar1 = (pointer)(local_80._24_8_ + 0x28);
        local_80._24_8_ = psVar7;
      } while ((psVar1->settings).num_buckets == 0);
    }
    local_80._24_8_ = psVar7;
    google::
    sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)local_80);
    local_d0._8_8_ =
         ((_Vector_impl_data *)
         ((long)&(this->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.table + 0x10))->_M_start;
    local_c0._0_8_ =
         *(pointer *)
          ((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.table + 0x18);
    local_d0._0_8_ = local_88;
    local_c0._16_8_ = (pointer)0x0;
    local_90 = (const_nonempty_iterator)0x0;
    local_c0._8_8_ = local_c0._0_8_;
    local_c0._24_8_ = local_d0._8_8_;
    local_c0._32_8_ = local_c0._0_8_;
    local_98._M_current =
         (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *
         )local_c0._0_8_;
    google::
    sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)local_d0);
    if (((uVar3 == local_d0._8_8_) && (uVar4 == local_c0._0_8_)) && (uVar5 == local_c0._8_8_)) {
      local_e0[0] = (internal)(uVar6 != local_c0._16_8_ && uVar5 != uVar4);
      local_d8 = (undefined8 *)0x0;
      if (uVar6 == local_c0._16_8_ || uVar5 == uVar4) {
        testing::Message::Message((Message *)&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d0,local_e0,(AssertionResult *)"i && (it++ != this->ht_.end())",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x142,(char *)local_d0._0_8_);
        testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        if ((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_d0._0_8_ !=
            (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_c0) {
          operator_delete((void *)local_d0._0_8_);
        }
        if (local_f0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_f0._M_head_impl + 8))();
        }
      }
    }
    else {
      local_e0[0] = (internal)0x1;
      local_d8 = (undefined8 *)0x0;
    }
    puVar2 = local_d8;
    if (local_d8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_d8 != local_d8 + 2) {
        operator_delete((undefined8 *)*local_d8);
      }
      operator_delete(puVar2);
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 10) {
      local_d0._8_8_ =
           ((_Vector_impl_data *)
           ((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.table + 0x10))->_M_start;
      local_c0._0_8_ =
           *(pointer *)
            ((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.table + 0x18);
      local_d0._0_8_ = local_88;
      local_c0._16_8_ = (pointer)0x0;
      local_90 = (const_nonempty_iterator)0x0;
      local_c0._8_8_ = local_c0._0_8_;
      local_c0._24_8_ = local_d0._8_8_;
      local_c0._32_8_ = local_c0._0_8_;
      local_98._M_current =
           (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)local_c0._0_8_;
      google::
      sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_deleted
                ((sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)local_d0);
      local_e0[0] = (internal)0x0;
      if (local_80._8_8_ == local_d0._8_8_) {
        if ((local_80._16_8_ == local_c0._0_8_) && (local_80._24_8_ == local_c0._8_8_)) {
          if (local_80._24_8_ == local_80._16_8_) {
            local_e0[0] = (internal)0x1;
          }
          else {
            local_e0[0] = (internal)(local_80._32_8_ == local_c0._16_8_);
          }
        }
        else {
          local_e0[0] = (internal)0x0;
        }
      }
      local_d8 = (undefined8 *)0x0;
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d0,local_e0,(AssertionResult *)"it == this->ht_.end()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x144,(char *)local_d0._0_8_);
        testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        if ((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_d0._0_8_ !=
            (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)local_c0) {
          operator_delete((void *)local_d0._0_8_);
        }
        if (local_f0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_f0._M_head_impl + 8))();
        }
      }
      puVar2 = local_d8;
      if (local_d8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_d8 != local_d8 + 2) {
          operator_delete((undefined8 *)*local_d8);
        }
        operator_delete(puVar2);
      }
      return;
    }
  } while( true );
}

Assistant:

TYPED_TEST(HashtableAllTest, Iterating) {
  // Test a bit more iterating than just one ++.
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  typename TypeParam::iterator it = this->ht_.begin();
  for (int i = 1; i <= 9; i++) {  // start at 1 so i is never 0
    // && here makes it easier to tell what loop iteration the test failed on.
    EXPECT_TRUE(i && (it++ != this->ht_.end()));
  }
  EXPECT_TRUE(it == this->ht_.end());
}